

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.c
# Opt level: O0

_Bool golf_editor_is_edit_entity_selected(golf_edit_mode_entity_t entity)

{
  _Bool _Var1;
  golf_edit_mode_entity_t entity2;
  int i;
  golf_edit_mode_entity_t entity_local;
  
  entity2.idx = 0;
  while( true ) {
    if (editor.edit_mode.selected_entities.length <= entity2.idx) {
      return false;
    }
    _Var1 = golf_editor_edit_entities_compare
                      (entity,editor.edit_mode.selected_entities.data[entity2.idx]);
    if (_Var1) break;
    entity2.idx = entity2.idx + 1;
  }
  return true;
}

Assistant:

bool golf_editor_is_edit_entity_selected(golf_edit_mode_entity_t entity) {
    for (int i = 0; i < editor.edit_mode.selected_entities.length; i++) {
        golf_edit_mode_entity_t entity2 = editor.edit_mode.selected_entities.data[i];
        if (golf_editor_edit_entities_compare(entity, entity2)) {
            return true;
        }
    }
    return false;
}